

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_8::DiskDirectory::trySymlink
          (DiskDirectory *this,PathPtr linkpath,StringPtr content,WriteMode mode)

{
  bool bVar1;
  WriteMode mode_local;
  DiskDirectory *this_local;
  StringPtr content_local;
  PathPtr linkpath_local;
  
  bVar1 = DiskHandle::trySymlink(&this->super_DiskHandle,linkpath,content,mode);
  return bVar1;
}

Assistant:

bool trySymlink(PathPtr linkpath, StringPtr content, WriteMode mode) const override {
    return DiskHandle::trySymlink(linkpath, content, mode);
  }